

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,texcoord2h *value)

{
  bool bVar1;
  half hVar2;
  reference pvVar3;
  array<float,_2UL> local_28;
  float2 v;
  texcoord2h *value_local;
  AsciiParser *this_local;
  
  v._M_elems = (_Type)value;
  bVar1 = ParseBasicTypeTuple<float,2ul>(this,&local_28);
  if (bVar1) {
    pvVar3 = ::std::array<float,_2UL>::operator[](&local_28,0);
    hVar2 = tinyusdz::value::float_to_half_full(*pvVar3);
    *(uint16_t *)v._M_elems = hVar2.value;
    pvVar3 = ::std::array<float,_2UL>::operator[](&local_28,1);
    hVar2 = tinyusdz::value::float_to_half_full(*pvVar3);
    *(uint16_t *)((long)v._M_elems + 2) = hVar2.value;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::texcoord2h *value) {
  // parse as float2
  value::float2 v;
  if (ParseBasicTypeTuple(&v)) {
    value->s = value::float_to_half_full(v[0]);
    value->t = value::float_to_half_full(v[1]);
    return true;
  }
  return false;
}